

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenerators::ListQt4RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  bool bVar1;
  string *filename;
  cmSourceFileLocation *pcVar2;
  long lVar3;
  string qrcEntry;
  string tag;
  string qrcContents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  RegularExpression fileMatchRegex;
  RegularExpression fileReplaceRegex;
  
  filename = cmSourceFile::GetFullPath(sf,(string *)0x0);
  ReadAll(&qrcContents,filename);
  cmsys::RegularExpression::RegularExpression(&fileMatchRegex,"(<file[^<]+)");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  while( true ) {
    bVar1 = cmsys::RegularExpression::find(&fileMatchRegex,qrcContents._M_dataplus._M_p + lVar3);
    if (!bVar1) break;
    cmsys::RegularExpression::match_abi_cxx11_(&qrcEntry,&fileMatchRegex,1);
    lVar3 = lVar3 + qrcEntry._M_string_length;
    cmsys::RegularExpression::RegularExpression(&fileReplaceRegex,"(^<file[^>]*>)");
    cmsys::RegularExpression::find(&fileReplaceRegex,qrcEntry._M_dataplus._M_p);
    cmsys::RegularExpression::match_abi_cxx11_(&tag,&fileReplaceRegex,1);
    std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&qrcEntry);
    std::__cxx11::string::operator=((string *)&qrcEntry,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    bVar1 = cmsys::SystemTools::FileIsFullPath(qrcEntry._M_dataplus._M_p);
    if (!bVar1) {
      pcVar2 = cmSourceFile::GetLocation(sf);
      std::operator+(&local_210,&pcVar2->Directory,"/");
      std::operator+(&local_1f0,&local_210,&qrcEntry);
      std::__cxx11::string::operator=((string *)&qrcEntry,(string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(depends,&qrcEntry);
    std::__cxx11::string::~string((string *)&tag);
    cmsys::RegularExpression::~RegularExpression(&fileReplaceRegex);
    std::__cxx11::string::~string((string *)&qrcEntry);
  }
  cmsys::RegularExpression::~RegularExpression(&fileMatchRegex);
  std::__cxx11::string::~string((string *)&qrcContents);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ListQt4RccInputs(cmSourceFile* sf,
                                            std::vector<std::string>& depends)
{
  const std::string qrcContents = ReadAll(sf->GetFullPath());

  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");

  std::string entriesList;
  const char* sep = "";

  size_t offset = 0;
  while (fileMatchRegex.find(qrcContents.c_str() + offset))
    {
    std::string qrcEntry = fileMatchRegex.match(1);

    offset += qrcEntry.size();

    cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");
    fileReplaceRegex.find(qrcEntry);
    std::string tag = fileReplaceRegex.match(1);

    qrcEntry = qrcEntry.substr(tag.size());

    if (!cmSystemTools::FileIsFullPath(qrcEntry.c_str()))
      {
      qrcEntry = sf->GetLocation().GetDirectory() + "/" + qrcEntry;
      }

    entriesList += sep;
    entriesList += qrcEntry;
    sep = "@list_sep@";
    depends.push_back(qrcEntry);
    }
  return entriesList;
}